

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,uchar *sig64,uchar *msg32,
              secp256k1_pubkey *pubkeys,size_t n_pubkeys)

{
  int iVar1;
  long in_RCX;
  uchar *in_RDX;
  long in_RSI;
  secp256k1_ecmult_context *in_RDI;
  long in_R8;
  long in_R9;
  secp256k1_verify_callback_data cbdata;
  int overflow;
  secp256k1_fe r_x;
  secp256k1_ge pk_sum_ge;
  secp256k1_gej pk_sum;
  secp256k1_scalar g_sc;
  char *in_stack_fffffffffffffe38;
  secp256k1_callback *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  bool bVar2;
  secp256k1_scalar *in_stack_fffffffffffffe50;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_fe *in_stack_fffffffffffffe60;
  secp256k1_gej *in_stack_fffffffffffffe88;
  secp256k1_ge *in_stack_fffffffffffffe90;
  int local_15c;
  secp256k1_fe local_158;
  uchar *in_stack_fffffffffffffed8;
  secp256k1_fe *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  secp256k1_pubkey *in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  secp256k1_context *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff40;
  secp256k1_ecmult_multi_callback *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_scratch *in_stack_ffffffffffffff60;
  secp256k1_ecmult_context *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff80;
  uint local_4;
  
  iVar1 = secp256k1_ecmult_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_4 = 0;
  }
  else if (in_RDX == (uchar *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_4 = 0;
  }
  else if (in_R9 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_fe_set_b32(&local_158,in_RDX);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32
                (in_stack_fffffffffffffe50,
                 (uchar *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 (int *)in_stack_fffffffffffffe40);
      if (local_15c == 0) {
        secp256k1_compute_prehash
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        iVar1 = secp256k1_ecmult_multi_var
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff80);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          secp256k1_ge_set_gej(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          iVar1 = secp256k1_fe_equal_var(in_stack_fffffffffffffe60,&in_stack_fffffffffffffe58->x);
          bVar2 = false;
          if (iVar1 != 0) {
            iVar1 = secp256k1_gej_has_quad_y_var(in_stack_fffffffffffffe58);
            bVar2 = iVar1 != 0;
          }
          local_4 = (uint)bVar2;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const unsigned char *sig64, const unsigned char *msg32, const secp256k1_pubkey *pubkeys, size_t n_pubkeys) {
    secp256k1_scalar g_sc;
    secp256k1_gej pk_sum;
    secp256k1_ge pk_sum_ge;
    secp256k1_fe r_x;
    int overflow;
    secp256k1_verify_callback_data cbdata;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkeys != NULL);
    (void) ctx;

    if (n_pubkeys == 0) {
        return 0;
    }

    /* extract R */
    if (!secp256k1_fe_set_b32(&r_x, sig64)) {
        return 0;
    }

    /* extract s */
    secp256k1_scalar_set_b32(&g_sc, sig64 + 32, &overflow);
    if (overflow) {
        return 0;
    }

    /* Populate callback data */
    cbdata.ctx = ctx;
    cbdata.pubkeys = pubkeys;
    secp256k1_compute_prehash(ctx, cbdata.prehash, pubkeys, n_pubkeys, &r_x, msg32);

    /* Compute sum sG - e_i*P_i, which should be R */
    if (!secp256k1_ecmult_multi_var(&ctx->ecmult_ctx, scratch, &pk_sum, &g_sc, secp256k1_aggsig_verify_callback, &cbdata, n_pubkeys)) {
        return 0;
    }

    /* Check sum */
    secp256k1_ge_set_gej(&pk_sum_ge, &pk_sum);
    return secp256k1_fe_equal_var(&r_x, &pk_sum_ge.x) &&
           secp256k1_gej_has_quad_y_var(&pk_sum);
}